

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionFormulaIndex.hpp
# Opt level: O0

void __thiscall
Indexing::InductionFormulaIndex::Entry::add(Entry *this,ClauseStack *cls,Substitution *subst)

{
  bool bVar1;
  Stack<Kernel::Clause_*> *in_RSI;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *in_RDI;
  Clause **cl;
  Clause **__end2;
  Clause **__begin2;
  ClauseStack *__range2;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> *this_00;
  Stack<std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>_> *in_stack_ffffffffffffff70;
  pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution> local_80;
  Clause **local_38;
  Clause **local_30;
  Clause **local_28;
  Stack<Kernel::Clause_*> *local_20;
  Stack<Kernel::Clause_*> *local_10;
  
  local_10 = in_RSI;
  bVar1 = Lib::Stack<Kernel::Clause_*>::isEmpty(in_RSI);
  if (!bVar1) {
    local_20 = local_10;
    local_28 = Lib::Stack<Kernel::Clause_*>::begin(local_10);
    local_30 = Lib::Stack<Kernel::Clause_*>::end(local_20);
    for (; local_28 != local_30; local_28 = local_28 + 1) {
      local_38 = local_28;
      Kernel::Clause::incRefCnt(*local_28);
    }
    this_00 = &local_80;
    std::make_pair<Lib::Stack<Kernel::Clause*>&,Kernel::Substitution&>
              (&in_RDI->first,(Substitution *)this_00);
    Lib::Stack<std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>_>::push
              (in_stack_ffffffffffffff70,in_RDI);
    std::pair<Lib::Stack<Kernel::Clause_*>,_Kernel::Substitution>::~pair(this_00);
  }
  return;
}

Assistant:

void add(ClauseStack&& cls, Substitution&& subst) {
      if (cls.isEmpty()) {
        return;
      }
      // Increase refcount of each clause so that no deallocation
      // occurs due to all children being redundant.
      for (const auto& cl : cls) {
        cl->incRefCnt();
      }
      _st.push(std::make_pair(cls, subst));
    }